

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O2

void AddSingleSector(plane *scrollplane,sector_t_conflict *sector,int movetype)

{
  byte *pbVar1;
  FLinkedSector *pFVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  FLinkedSector newlink;
  FLinkedSector local_10;
  
  pFVar2 = (scrollplane->Sectors).Array;
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if ((ulong)(scrollplane->Sectors).Count * 0x10 + 0x10 == lVar5 + 0x10) {
      local_10.Sector = sector;
      local_10.Type = movetype;
      TArray<FLinkedSector,_FLinkedSector>::Push(&scrollplane->Sectors,&local_10);
      return;
    }
    lVar3 = lVar5 + 0x10;
  } while (*(sector_t_conflict **)((long)&pFVar2->Sector + lVar5) != sector);
  if ((movetype & 5U) != 0) {
    pbVar1 = (byte *)((long)&pFVar2->Type + lVar5);
    *pbVar1 = *pbVar1 & 0xfa;
  }
  uVar4 = *(uint *)((long)&pFVar2->Type + lVar5);
  if ((movetype & 10U) != 0) {
    uVar4 = uVar4 & 0xfffffff5;
    *(uint *)((long)&pFVar2->Type + lVar5) = uVar4;
  }
  *(uint *)((long)&pFVar2->Type + lVar5) = uVar4 | movetype;
  return;
}

Assistant:

static void AddSingleSector(extsector_t::linked::plane &scrollplane, sector_t *sector, int movetype)
{
	// First we have to check the list if the sector is already in it
	// If so the move type must be adjusted

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Sector == sector)
		{
			if (movetype & LINK_FLOORBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_FLOORBITS;
			}

			if (movetype & LINK_CEILINGBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_CEILINGBITS;
			}

			scrollplane.Sectors[i].Type |= movetype;
			return;
		}
	}

	// The sector hasn't been attached yet so do it now

	FLinkedSector newlink = {sector, movetype};
	scrollplane.Sectors.Push(newlink);
}